

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdiagonal.c
# Opt level: O1

int sdominate(int n,NCformat *Astore)

{
  ulong uVar1;
  long lVar2;
  float fVar3;
  int_t *addr;
  int_t *piVar4;
  void *addr_00;
  int iVar5;
  float *pfVar6;
  int_t *piVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  float fVar17;
  
  addr = Astore->rowind;
  piVar4 = Astore->colptr;
  uVar16 = (ulong)(uint)n;
  if (n < 1) {
    iVar5 = 0;
  }
  else {
    uVar8 = 0;
    iVar5 = 0;
    do {
      iVar14 = piVar4[uVar8];
      uVar9 = 1;
      if (iVar14 < piVar4[uVar8 + 1]) {
        uVar9 = 0xffffffff;
        lVar12 = 0;
        do {
          if (uVar8 == (uint)addr[iVar14 + lVar12]) {
            uVar9 = iVar14 + (int)lVar12;
          }
          lVar12 = lVar12 + 1;
        } while ((long)piVar4[uVar8 + 1] - (long)iVar14 != lVar12);
        uVar9 = uVar9 >> 0x1f;
      }
      iVar5 = iVar5 + uVar9;
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar16);
  }
  addr_00 = Astore->nzval;
  if (iVar5 == 0) {
    if (0 < n) {
      uVar8 = 0;
      do {
        iVar5 = piVar4[uVar8];
        lVar13 = (long)iVar5;
        lVar12 = -1;
        fVar17 = 3e-06;
        if (iVar5 < piVar4[uVar8 + 1]) {
          iVar14 = -1;
          lVar12 = 0;
          fVar17 = 1e-06;
          do {
            if (uVar8 == (uint)addr[lVar13 + lVar12]) {
              iVar14 = iVar5 + (int)lVar12;
            }
            fVar17 = fVar17 + ABS(*(float *)((long)addr_00 + lVar12 * 4 + lVar13 * 4));
            lVar12 = lVar12 + 1;
          } while (piVar4[uVar8 + 1] - lVar13 != lVar12);
          fVar17 = fVar17 * 3.0;
          lVar12 = (long)iVar14;
        }
        uVar8 = uVar8 + 1;
        *(float *)((long)addr_00 + lVar12 * 4) = fVar17;
      } while (uVar8 != uVar16);
    }
    iVar5 = 0;
  }
  else {
    iVar14 = piVar4[n];
    pfVar6 = floatMalloc((long)iVar5 + (long)iVar14);
    piVar7 = intMalloc((int_t)((long)iVar5 + (long)iVar14));
    if (n < 1) {
      iVar5 = 0;
    }
    else {
      iVar5 = 0;
      uVar8 = 0;
      do {
        lVar13 = (long)piVar4[uVar8];
        lVar12 = (long)iVar5;
        uVar1 = uVar8 + 1;
        iVar14 = piVar4[uVar8 + 1];
        iVar10 = -1;
        fVar17 = 3e-06;
        iVar11 = (int)(lVar13 - lVar12);
        if (iVar11 < iVar14) {
          iVar10 = -1;
          lVar15 = 0;
          fVar17 = 1e-06;
          do {
            uVar9 = addr[(lVar13 + lVar15) - lVar12];
            piVar7[lVar13 + lVar15] = uVar9;
            if (uVar8 == uVar9) {
              iVar10 = iVar11 + (int)lVar15;
            }
            fVar3 = *(float *)((long)addr_00 + lVar15 * 4 + lVar13 * 4 + lVar12 * -4);
            pfVar6[lVar13 + lVar15] = fVar3;
            fVar17 = fVar17 + ABS(fVar3);
            iVar14 = piVar4[uVar1];
            lVar2 = (lVar13 - lVar12) + lVar15;
            lVar15 = lVar15 + 1;
          } while (lVar2 + 1 < (long)iVar14);
          fVar17 = fVar17 * 3.0;
        }
        if (iVar10 < 0) {
          piVar7[iVar14 + iVar5] = (int_t)uVar8;
          pfVar6[piVar4[uVar1] + lVar12] = fVar17;
          iVar5 = iVar5 + 1;
        }
        else {
          pfVar6[iVar10 + iVar5] = fVar17;
        }
        piVar4[uVar1] = piVar4[uVar1] + iVar5;
        uVar8 = uVar1;
      } while (uVar1 != uVar16);
    }
    Astore->nzval = pfVar6;
    Astore->rowind = piVar7;
    superlu_free(addr_00);
    superlu_free(addr);
  }
  Astore->nnz = Astore->nnz + iVar5;
  return iVar5;
}

Assistant:

int sdominate(int n, NCformat *Astore)
/* make the matrix diagonally dominant */
{
    float *nzval = (float *)Astore->nzval;
    int_t *rowind = Astore->rowind;
    int_t *colptr = Astore->colptr;
    int_t nnz = colptr[n];
    int fill = 0;
    float *nzval_new;
    int_t *rowind_new;
    int_t i, j, diag;
    double s;

    for (i = 0; i < n; i++)
    {
	diag = -1;
	for (j = colptr[i]; j < colptr[i + 1]; j++)
	    if (rowind[j] == i) diag = j;
	if (diag < 0) fill++;
    }
    if (fill)
    {
	nzval_new = floatMalloc(nnz + fill);
	rowind_new = intMalloc(nnz+ fill);
	fill = 0;
	for (i = 0; i < n; i++)
	{
	    s = 1e-6;
	    diag = -1;
	    for (j = colptr[i] - fill; j < colptr[i + 1]; j++)
	    {
		if ((rowind_new[j + fill] = rowind[j]) == i) diag = j;
		s += fabs(nzval_new[j + fill] = nzval[j]);
	    }
	    if (diag >= 0) {
		nzval_new[diag+fill] = s * 3.0;
	    } else {
		rowind_new[colptr[i + 1] + fill] = i;
		nzval_new[colptr[i + 1] + fill] = s * 3.0;
		fill++;
	    }
	    colptr[i + 1] += fill;
	}
	Astore->nzval = nzval_new;
	Astore->rowind = rowind_new;
	SUPERLU_FREE(nzval);
	SUPERLU_FREE(rowind);
    }
    else
    {
	for (i = 0; i < n; i++)
	{
	    s = 1e-6;
	    diag = -1;
	    for (j = colptr[i]; j < colptr[i + 1]; j++)
	    {
		if (rowind[j] == i) diag = j;
		s += fabs(nzval[j]);
	    }
	    nzval[diag] = s * 3.0;
	}
    }
    Astore->nnz += fill;
    return fill;
}